

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O3

REF_STATUS ref_node_pack(REF_NODE ref_node,REF_INT *o2n,REF_INT *n2o)

{
  int iVar1;
  REF_GLOB *pRVar2;
  REF_GLOB *pRVar3;
  REF_INT *pRVar4;
  REF_INT *pRVar5;
  REF_DBL *pRVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint uVar10;
  REF_NODE in_RAX;
  long lVar11;
  int iVar12;
  undefined8 uVar13;
  long lVar14;
  REF_DBL *pRVar15;
  long lVar16;
  char *pcVar17;
  ulong uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  REF_NODE copy;
  REF_NODE local_28;
  
  local_28 = in_RAX;
  uVar10 = ref_node_deep_copy(&local_28,ref_node->ref_mpi,ref_node);
  if (uVar10 != 0) {
    pcVar17 = "make a copy first";
    uVar13 = 0xb2;
    goto LAB_001686a8;
  }
  uVar10 = ref_node->n;
  lVar11 = (long)(int)uVar10;
  if (0 < lVar11) {
    pRVar2 = local_28->global;
    pRVar3 = ref_node->global;
    lVar14 = 0;
    do {
      pRVar3[lVar14] = pRVar2[n2o[lVar14]];
      lVar14 = lVar14 + 1;
    } while (lVar11 != lVar14);
  }
  auVar9 = _DAT_001ff260;
  auVar8 = _DAT_001ff250;
  iVar1 = ref_node->max;
  iVar12 = -1;
  if ((int)uVar10 < iVar1) {
    pRVar2 = ref_node->global;
    lVar14 = iVar1 - lVar11;
    lVar16 = lVar14 + -1;
    auVar19._8_4_ = (int)lVar16;
    auVar19._0_8_ = lVar16;
    auVar19._12_4_ = (int)((ulong)lVar16 >> 0x20);
    lVar16 = -4 - lVar11;
    uVar18 = 0;
    auVar19 = auVar19 ^ _DAT_001ff260;
    do {
      auVar20._8_4_ = (int)uVar18;
      auVar20._0_8_ = uVar18;
      auVar20._12_4_ = (int)(uVar18 >> 0x20);
      auVar20 = (auVar20 | auVar8) ^ auVar9;
      if ((bool)(~(auVar20._4_4_ == auVar19._4_4_ && auVar19._0_4_ < auVar20._0_4_ ||
                  auVar19._4_4_ < auVar20._4_4_) & 1)) {
        pRVar2[lVar11 + uVar18] = lVar16 + 1;
      }
      if ((auVar20._12_4_ != auVar19._12_4_ || auVar20._8_4_ <= auVar19._8_4_) &&
          auVar20._12_4_ <= auVar19._12_4_) {
        pRVar2[lVar11 + uVar18 + 1] = lVar16;
      }
      uVar18 = uVar18 + 2;
      lVar16 = lVar16 + -2;
    } while ((lVar14 + 1U & 0xfffffffffffffffe) != uVar18);
    pRVar2[(long)iVar1 + -1] = -1;
    iVar12 = -2 - uVar10;
  }
  ref_node->blank = iVar12;
  if ((int)uVar10 < 1) {
LAB_00168620:
    bVar7 = false;
LAB_00168622:
    lVar11 = (long)ref_node->naux;
    if (bVar7 && 0 < lVar11) {
      pRVar6 = local_28->aux;
      iVar1 = local_28->naux;
      pRVar15 = ref_node->aux;
      uVar18 = 0;
      do {
        iVar12 = n2o[uVar18];
        lVar14 = 0;
        do {
          pRVar15[lVar14] = pRVar6[(long)iVar12 * (long)iVar1 + lVar14];
          lVar14 = lVar14 + 1;
        } while (lVar11 != lVar14);
        uVar18 = uVar18 + 1;
        pRVar15 = pRVar15 + lVar11;
      } while (uVar18 != uVar10);
    }
  }
  else {
    pRVar4 = local_28->sorted_local;
    pRVar5 = ref_node->sorted_local;
    lVar11 = 0;
    do {
      pRVar5[lVar11] = o2n[pRVar4[lVar11]];
      lVar11 = lVar11 + 1;
      uVar10 = ref_node->n;
    } while (lVar11 < (int)uVar10);
    if ((int)uVar10 < 1) goto LAB_00168620;
    pRVar4 = local_28->part;
    pRVar5 = ref_node->part;
    lVar11 = 0;
    do {
      pRVar5[lVar11] = pRVar4[n2o[lVar11]];
      lVar11 = lVar11 + 1;
      uVar10 = ref_node->n;
    } while (lVar11 < (int)uVar10);
    if ((int)uVar10 < 1) goto LAB_00168620;
    pRVar4 = local_28->age;
    pRVar5 = ref_node->age;
    lVar11 = 0;
    do {
      pRVar5[lVar11] = pRVar4[n2o[lVar11]];
      lVar11 = lVar11 + 1;
      uVar10 = ref_node->n;
    } while (lVar11 < (int)uVar10);
    bVar7 = 0 < (int)uVar10;
    if (0 < (int)uVar10) {
      pRVar6 = local_28->real;
      pRVar15 = ref_node->real;
      lVar11 = 0;
      do {
        iVar1 = n2o[lVar11];
        lVar14 = 0;
        do {
          pRVar15[lVar14] = pRVar6[(long)iVar1 * 0xf + lVar14];
          lVar14 = lVar14 + 1;
        } while (lVar14 != 0xf);
        lVar11 = lVar11 + 1;
        pRVar15 = pRVar15 + 0xf;
      } while (lVar11 != (int)uVar10);
      goto LAB_00168622;
    }
  }
  uVar10 = ref_node_free(local_28);
  if (uVar10 == 0) {
    return 0;
  }
  pcVar17 = "release copy";
  uVar13 = 0xd2;
LAB_001686a8:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar13,
         "ref_node_pack",(ulong)uVar10,pcVar17);
  return uVar10;
}

Assistant:

REF_FCN REF_STATUS ref_node_pack(REF_NODE ref_node, REF_INT *o2n,
                                 REF_INT *n2o) {
  REF_INT i, node;
  REF_NODE copy;
  RSS(ref_node_deep_copy(&copy, ref_node_mpi(ref_node), ref_node),
      "make a copy first");

  for (node = 0; node < ref_node_n(ref_node); node++)
    ref_node->global[node] = copy->global[n2o[node]];
  if (ref_node_n(ref_node) < ref_node_max(ref_node)) {
    for (node = ref_node_n(ref_node); node < ref_node_max(ref_node); node++)
      ref_node->global[node] = index2next(node + 1);
    ref_node->global[(ref_node->max) - 1] = REF_EMPTY;
    ref_node->blank = index2next(ref_node_n(ref_node));
  } else {
    ref_node->blank = REF_EMPTY;
  }

  for (node = 0; node < ref_node_n(ref_node); node++)
    ref_node->sorted_local[node] = o2n[copy->sorted_local[node]];

  for (node = 0; node < ref_node_n(ref_node); node++)
    ref_node->part[node] = copy->part[n2o[node]];

  for (node = 0; node < ref_node_n(ref_node); node++)
    ref_node->age[node] = copy->age[n2o[node]];

  for (node = 0; node < ref_node_n(ref_node); node++)
    for (i = 0; i < REF_NODE_REAL_PER; i++)
      ref_node_real(ref_node, i, node) = ref_node_real(copy, i, n2o[node]);

  if (ref_node_naux(ref_node) > 0) {
    for (node = 0; node < ref_node_n(ref_node); node++)
      for (i = 0; i < ref_node_naux(ref_node); i++)
        ref_node_aux(ref_node, i, node) = ref_node_aux(copy, i, n2o[node]);
  }

  RSS(ref_node_free(copy), "release copy");

  return REF_SUCCESS;
}